

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void hashkey(connectdata *conn,char *buf,size_t len)

{
  uint uVar1;
  int iVar2;
  char **ppcVar3;
  
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar1 & 9) == 1) {
    ppcVar3 = &(conn->http_proxy).host.name;
    iVar2 = conn->port;
  }
  else {
    iVar2 = conn->remote_port;
    if ((uVar1 >> 9 & 1) == 0) {
      ppcVar3 = &(conn->host).name;
    }
    else {
      ppcVar3 = &(conn->conn_to_host).name;
    }
  }
  curl_msnprintf(buf,0x80,"%u/%ld/%s",(ulong)conn->scope_id,(long)iVar2,*ppcVar3);
  Curl_strntolower(buf,buf,0x80);
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf, size_t len)
{
  const char *hostname;
  long port = conn->remote_port;
  DEBUGASSERT(len >= HASHKEY_SIZE);
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    hostname = conn->http_proxy.host.name;
    port = conn->port;
  }
  else
#endif
    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  /* put the numbers first so that the hostname gets cut off if too long */
#ifdef ENABLE_IPV6
  msnprintf(buf, len, "%u/%ld/%s", conn->scope_id, port, hostname);
#else
  msnprintf(buf, len, "%ld/%s", port, hostname);
#endif
  Curl_strntolower(buf, buf, len);
}